

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O3

Vec_Ptr_t * collectUserGivenDisjunctiveMonotoneSignals(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  
  pVVar1 = (Vec_Ptr_t *)calloc(1,0x10);
  pVVar2 = pNtk->vPos;
  pVVar9 = (Vec_Ptr_t *)0x0;
  if (0 < pVVar2->nSize) {
    iVar10 = 0;
    lVar7 = 0;
    do {
      pcVar3 = Abc_ObjName((Abc_Obj_t *)pVVar2->pArray[lVar7]);
      pcVar3 = strstr(pcVar3,"csLevel1Stabil_");
      if (pcVar3 != (char *)0x0) {
        pVVar4 = createSingletonIntVector((int)lVar7);
        iVar8 = (int)pVVar9;
        if (iVar10 == iVar8) {
          if (iVar8 < 0x10) {
            if (pVVar1->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar1->pArray,0x80);
            }
            pVVar1->pArray = ppvVar5;
            pVVar1->nCap = 0x10;
            pVVar9 = (Vec_Ptr_t *)&DAT_00000010;
          }
          else {
            pVVar9 = (Vec_Ptr_t *)(ulong)(uint)(iVar8 * 2);
            if (pVVar1->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((long)pVVar9 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar1->pArray,(long)pVVar9 * 8);
            }
            pVVar1->pArray = ppvVar5;
            pVVar1->nCap = iVar8 * 2;
          }
        }
        else {
          ppvVar5 = pVVar1->pArray;
        }
        lVar6 = (long)iVar10;
        iVar10 = iVar10 + 1;
        pVVar1->nSize = iVar10;
        ppvVar5[lVar6] = pVVar4;
      }
      lVar7 = lVar7 + 1;
      pVVar2 = pNtk->vPos;
    } while (lVar7 < pVVar2->nSize);
    pVVar9 = (Vec_Ptr_t *)0x0;
    if (0 < iVar10) {
      pVVar9 = pVVar1;
    }
  }
  return pVVar9;
}

Assistant:

Vec_Ptr_t *collectUserGivenDisjunctiveMonotoneSignals( Abc_Ntk_t *pNtk )
{
	Abc_Obj_t *pObj;
	int i;
	Vec_Ptr_t *monotoneVector;
	Vec_Int_t *newIntVector;

	monotoneVector = Vec_PtrAlloc(0);	
	Abc_NtkForEachPo( pNtk, pObj, i )
	{
		if( strstr( Abc_ObjName( pObj ), "csLevel1Stabil_" ) != NULL )
		{
			newIntVector = createSingletonIntVector(i);
			Vec_PtrPush(monotoneVector, newIntVector);
		}
	}

	if( Vec_PtrSize(monotoneVector) > 0 )
		return monotoneVector;
	else
		return NULL;

}